

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_reflection_class.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::ReflectionClassGenerator::WriteGeneratedCodeInfo
          (ReflectionClassGenerator *this,Descriptor *descriptor,Printer *printer,bool last)

{
  pointer *ppbVar1;
  ulong uVar2;
  pointer *__return_storage_ptr__;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  EnumDescriptor *extraout_RDX_02;
  EnumDescriptor *extraout_RDX_03;
  EnumDescriptor *extraout_RDX_04;
  EnumDescriptor *descriptor_00;
  FieldDescriptor *extraout_RDX_05;
  FieldDescriptor *extraout_RDX_06;
  FieldDescriptor *extraout_RDX_07;
  FieldDescriptor *extraout_RDX_08;
  FieldDescriptor *pFVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  undefined1 auStack_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fields;
  
  if (*(char *)(*(long *)(descriptor + 0x20) + 0x4b) == '\0') {
    __return_storage_ptr__ =
         &fields.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
    GetClassName_abi_cxx11_
              ((string *)__return_storage_ptr__,(csharp *)descriptor,(Descriptor *)printer);
    io::Printer::Print<char[10],std::__cxx11::string>
              (printer,"new pbr::GeneratedClrTypeInfo(typeof($type_name$), $type_name$.Parser, ",
               (char (*) [10])0x2a27d4,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__);
    if (fields.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&stack0xffffffffffffffc0) {
      operator_delete(fields.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if ((long)*(int *)(descriptor + 0x68) < 1) {
      io::Printer::Print<>(printer,"null, ");
    }
    else {
      auStack_68 = (undefined1  [8])0x0;
      fields.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      fields.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_68,(long)*(int *)(descriptor + 0x68));
      if (0 < *(int *)(descriptor + 0x68)) {
        lVar4 = 0;
        ppbVar1 = &fields.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        lVar6 = 0;
        pFVar3 = extraout_RDX;
        do {
          GetPropertyName_abi_cxx11_
                    ((string *)ppbVar1,(csharp *)(*(long *)(descriptor + 0x28) + lVar4),pFVar3);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_68
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ppbVar1);
          pFVar3 = extraout_RDX_00;
          if (fields.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage !=
              (pointer)&stack0xffffffffffffffc0) {
            operator_delete(fields.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
            pFVar3 = extraout_RDX_01;
          }
          lVar6 = lVar6 + 1;
          lVar4 = lVar4 + 0x98;
        } while (lVar6 < *(int *)(descriptor + 0x68));
      }
      Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((string *)
                 &fields.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(protobuf *)auStack_68,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)"\", \"",(char *)__return_storage_ptr__);
      __return_storage_ptr__ =
           &fields.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
      io::Printer::Print<char[7],std::__cxx11::string>
                (printer,"new[]{ \"$fields$\" }, ",(char (*) [7])0x28ee0f,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__);
      if (fields.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&stack0xffffffffffffffc0) {
        operator_delete(fields.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_68);
    }
    if ((long)*(int *)(descriptor + 0x6c) < 1) {
      io::Printer::Print<>(printer,"null, ");
    }
    else {
      auStack_68 = (undefined1  [8])0x0;
      fields.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      fields.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_68,(long)*(int *)(descriptor + 0x6c));
      if (0 < *(int *)(descriptor + 0x6c)) {
        lVar4 = 0;
        ppbVar1 = &fields.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        lVar6 = 0;
        do {
          __return_storage_ptr__ = (pointer *)0x0;
          UnderscoresToCamelCase
                    ((string *)ppbVar1,*(string **)(*(long *)(descriptor + 0x30) + lVar4),true,false
                    );
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_68
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ppbVar1);
          if (fields.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage !=
              (pointer)&stack0xffffffffffffffc0) {
            operator_delete(fields.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          lVar6 = lVar6 + 1;
          lVar4 = lVar4 + 0x30;
        } while (lVar6 < *(int *)(descriptor + 0x6c));
      }
      Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((string *)
                 &fields.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(protobuf *)auStack_68,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)"\", \"",(char *)__return_storage_ptr__);
      __return_storage_ptr__ =
           &fields.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
      io::Printer::Print<char[7],std::__cxx11::string>
                (printer,"new[]{ \"$oneofs$\" }, ",(char (*) [7])"oneofs",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__);
      if (fields.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&stack0xffffffffffffffc0) {
        operator_delete(fields.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_68);
    }
    if ((long)*(int *)(descriptor + 0x78) < 1) {
      io::Printer::Print<>(printer,"null, ");
      pFVar3 = extraout_RDX_06;
    }
    else {
      auStack_68 = (undefined1  [8])0x0;
      fields.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      fields.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_68,(long)*(int *)(descriptor + 0x78));
      if (0 < *(int *)(descriptor + 0x78)) {
        lVar4 = 0;
        ppbVar1 = &fields.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        lVar6 = 0;
        descriptor_00 = extraout_RDX_02;
        do {
          GetClassName_abi_cxx11_
                    ((string *)ppbVar1,(csharp *)(*(long *)(descriptor + 0x40) + lVar4),
                     descriptor_00);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_68
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ppbVar1);
          descriptor_00 = extraout_RDX_03;
          if (fields.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage !=
              (pointer)&stack0xffffffffffffffc0) {
            operator_delete(fields.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
            descriptor_00 = extraout_RDX_04;
          }
          lVar6 = lVar6 + 1;
          lVar4 = lVar4 + 0x50;
        } while (lVar6 < *(int *)(descriptor + 0x78));
      }
      Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((string *)
                 &fields.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(protobuf *)auStack_68,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)"), typeof(",(char *)__return_storage_ptr__);
      __return_storage_ptr__ =
           &fields.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
      io::Printer::Print<char[6],std::__cxx11::string>
                (printer,"new[]{ typeof($enums$) }, ",(char (*) [6])0x2ca7b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__);
      if (fields.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&stack0xffffffffffffffc0) {
        operator_delete(fields.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_68);
      pFVar3 = extraout_RDX_05;
    }
    if (*(int *)(descriptor + 0x80) < 1) {
      io::Printer::Print<>(printer,"null, ");
    }
    else {
      auStack_68 = (undefined1  [8])0x0;
      fields.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      fields.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (0 < *(int *)(descriptor + 0x80)) {
        lVar4 = 0;
        ppbVar1 = &fields.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        lVar6 = 0;
        do {
          GetFullExtensionName_abi_cxx11_
                    ((string *)ppbVar1,(csharp *)(*(long *)(descriptor + 0x50) + lVar4),pFVar3);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_68
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ppbVar1);
          pFVar3 = extraout_RDX_07;
          if (fields.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage !=
              (pointer)&stack0xffffffffffffffc0) {
            operator_delete(fields.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
            pFVar3 = extraout_RDX_08;
          }
          lVar6 = lVar6 + 1;
          lVar4 = lVar4 + 0x98;
        } while (lVar6 < *(int *)(descriptor + 0x80));
      }
      Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((string *)
                 &fields.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(protobuf *)auStack_68,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x2b4e6a,(char *)__return_storage_ptr__);
      io::Printer::Print<char[11],std::__cxx11::string>
                (printer,"new pb::Extension[] { $extensions$ }, ",(char (*) [11])0x2cab90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &fields.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (fields.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&stack0xffffffffffffffc0) {
        operator_delete(fields.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_68);
    }
    if (*(int *)(descriptor + 0x74) < 1) {
      pcVar5 = "null";
    }
    else {
      io::Printer::Print<>(printer,"new pbr::GeneratedClrTypeInfo[] { ");
      uVar2 = (ulong)*(uint *)(descriptor + 0x74);
      pcVar5 = "}";
      if (0 < (int)*(uint *)(descriptor + 0x74)) {
        lVar4 = 0;
        uVar7 = 0;
        do {
          WriteGeneratedCodeInfo
                    (this,(Descriptor *)(*(long *)(descriptor + 0x38) + lVar4),printer,
                     uVar7 == (int)uVar2 - 1);
          uVar7 = uVar7 + 1;
          uVar2 = (ulong)*(int *)(descriptor + 0x74);
          lVar4 = lVar4 + 0x90;
        } while ((long)uVar7 < (long)uVar2);
        pcVar5 = "}";
      }
    }
    io::Printer::Print<>(printer,pcVar5);
    pcVar5 = "),\n";
    if (last) {
      pcVar5 = ")";
    }
  }
  else {
    pcVar5 = "null, ";
  }
  io::Printer::Print<>(printer,pcVar5);
  return;
}

Assistant:

void ReflectionClassGenerator::WriteGeneratedCodeInfo(const Descriptor* descriptor, io::Printer* printer, bool last) {
  if (IsMapEntryMessage(descriptor)) {
    printer->Print("null, ");
    return;
  }
  // Generated message type
  printer->Print("new pbr::GeneratedClrTypeInfo(typeof($type_name$), $type_name$.Parser, ", "type_name", GetClassName(descriptor));

  // Fields
  if (descriptor->field_count() > 0) {
      std::vector<std::string> fields;
      fields.reserve(descriptor->field_count());
      for (int i = 0; i < descriptor->field_count(); i++) {
          fields.push_back(GetPropertyName(descriptor->field(i)));
      }
      printer->Print("new[]{ \"$fields$\" }, ", "fields", Join(fields, "\", \""));
  }
  else {
      printer->Print("null, ");
  }

  // Oneofs
  if (descriptor->oneof_decl_count() > 0) {
      std::vector<std::string> oneofs;
      oneofs.reserve(descriptor->oneof_decl_count());
      for (int i = 0; i < descriptor->oneof_decl_count(); i++) {
          oneofs.push_back(UnderscoresToCamelCase(descriptor->oneof_decl(i)->name(), true));
      }
      printer->Print("new[]{ \"$oneofs$\" }, ", "oneofs", Join(oneofs, "\", \""));
  }
  else {
      printer->Print("null, ");
  }

  // Nested enums
  if (descriptor->enum_type_count() > 0) {
      std::vector<std::string> enums;
      enums.reserve(descriptor->enum_type_count());
      for (int i = 0; i < descriptor->enum_type_count(); i++) {
          enums.push_back(GetClassName(descriptor->enum_type(i)));
      }
      printer->Print("new[]{ typeof($enums$) }, ", "enums", Join(enums, "), typeof("));
  }
  else {
      printer->Print("null, ");
  }

  // Extensions
  if (descriptor->extension_count() > 0) {
    std::vector<std::string> extensions;
    for (int i = 0; i < descriptor->extension_count(); i++) {
      extensions.push_back(GetFullExtensionName(descriptor->extension(i)));
    }
    printer->Print("new pb::Extension[] { $extensions$ }, ", "extensions", Join(extensions, ", "));
  }
  else {
    printer->Print("null, ");
  }

  // Nested types
  if (descriptor->nested_type_count() > 0) {
      // Need to specify array type explicitly here, as all elements may be null.
      printer->Print("new pbr::GeneratedClrTypeInfo[] { ");
      for (int i = 0; i < descriptor->nested_type_count(); i++) {
          WriteGeneratedCodeInfo(descriptor->nested_type(i), printer, i == descriptor->nested_type_count() - 1);
      }
      printer->Print("}");
  }
  else {
      printer->Print("null");
  }
  printer->Print(last ? ")" : "),\n");
}